

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O2

void __thiscall
vigra::colormap<unsigned_int,_unsigned_char>::colormap
          (colormap<unsigned_int,_unsigned_char> *this,uint numTableElements,uint numTables,
          uint numTableBands)

{
  this->m_numTableElements = numTableElements;
  this->m_numTables = numTables;
  this->m_numTableBands = numTableBands;
  void_vector_base::void_vector_base
            (&(this->m_tables).super_void_vector_base,(ulong)(numTableElements * numTableBands));
  throw_precondition_error
            (numTableBands == 1 || numTables == 1,"numTables or numTableBands must be 1",
             "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/viff.cxx",
             0xd2);
  return;
}

Assistant:

colormap( const unsigned int numTableElements,
                  const unsigned int numTables,
                  const unsigned int numTableBands )
            : m_numTableElements(numTableElements),
              m_numTables(numTables), m_numTableBands(numTableBands),
              m_tables( numTableElements * numTableBands )
        {
            vigra_precondition( ( numTables == 1 ) || ( numTableBands == 1 ),
                                "numTables or numTableBands must be 1" );
        }